

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

off_t mem_seek(hFILE *fpv,off_t offset,int whence)

{
  int *piVar1;
  char *local_48;
  char *local_40;
  size_t origin;
  size_t absoffset;
  hFILE_mem *fp;
  int whence_local;
  off_t offset_local;
  hFILE *fpv_local;
  
  local_48 = (char *)offset;
  if (offset < 0) {
    local_48 = (char *)-offset;
  }
  if (whence == 0) {
    local_40 = (char *)0x0;
  }
  else if (whence == 1) {
    local_40 = fpv[1].end;
  }
  else {
    if (whence != 2) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      return -1;
    }
    local_40 = fpv[1].begin;
  }
  if (((offset < 0) && (local_40 < local_48)) ||
     ((-1 < offset && (fpv[1].begin + -(long)local_40 < local_48)))) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    fpv_local = (hFILE *)0xffffffffffffffff;
  }
  else {
    fpv[1].end = local_40 + offset;
    fpv_local = (hFILE *)fpv[1].end;
  }
  return (off_t)fpv_local;
}

Assistant:

static off_t mem_seek(hFILE *fpv, off_t offset, int whence)
{
    hFILE_mem *fp = (hFILE_mem *) fpv;
    size_t absoffset = (offset >= 0)? offset : -offset;
    size_t origin;

    switch (whence) {
    case SEEK_SET: origin = 0; break;
    case SEEK_CUR: origin = fp->pos; break;
    case SEEK_END: origin = fp->length; break;
    default: errno = EINVAL; return -1;
    }

    if ((offset  < 0 && absoffset > origin) ||
        (offset >= 0 && absoffset > fp->length - origin)) {
        errno = EINVAL;
        return -1;
    }

    fp->pos = origin + offset;
    return fp->pos;
}